

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test6(void)

{
  ostream *poVar1;
  vector<int,_std::allocator<int>_> *__range1;
  int iVar2;
  int *x;
  int *piVar3;
  bool bVar4;
  vector<int,_std::allocator<int>_> v2;
  Queue q;
  vector<int,_std::allocator<int>_> v1;
  _Vector_base<int,_std::allocator<int>_> local_78;
  queue<int> local_60;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  CP::queue<int>::queue(&local_60);
  for (iVar2 = 0; iVar2 != 2000; iVar2 = iVar2 + 2) {
    local_40._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar2;
    CP::queue<int>::push(&local_60,(int *)&local_40);
  }
  iVar2 = 200;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    CP::queue<int>::pop(&local_60);
  }
  CP::queue<int>::to_vector((vector<int,_std::allocator<int>_> *)&local_40,&local_60,200);
  for (iVar2 = 0; iVar2 != 20000; iVar2 = iVar2 + 0x14) {
    local_78._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar2;
    CP::queue<int>::push(&local_60,(int *)&local_78);
  }
  iVar2 = 300;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    CP::queue<int>::pop(&local_60);
  }
  CP::queue<int>::to_vector((vector<int,_std::allocator<int>_> *)&local_78,&local_60,0x514);
  for (piVar3 = (int *)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_78._M_impl.super__Vector_impl_data._M_start);
      piVar3 != local_78._M_impl.super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  CP::queue<int>::~queue(&local_60);
  return true;
}

Assistant:

bool test6() {
  Queue q;
  for (int i = 0;i < 1000;i++)
    q.push(i*2);
  for (int i = 0;i < 200;i++) q.pop();
  vector<int> v1 = q.to_vector(200);
  for (int i = 0;i < 1000;i++)
    q.push(i*20);
  for (int i = 0;i < 300;i++) q.pop();
  vector<int> v2 = q.to_vector(1300);
  for (auto &x : v2) {
    cout << x << " ";
  }
  cout << endl;
  return true;
}